

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::testGroupEnded(ConsoleReporter *this,TestGroupStats *_testGroupStats)

{
  bool bVar1;
  ostream *poVar2;
  ConsoleReporter *in_RSI;
  TestGroupStats *in_RDI;
  Totals *in_stack_00000148;
  ConsoleReporter *in_stack_00000150;
  
  bVar1 = Option<Catch::GroupInfo>::operator!
                    ((Option<Catch::GroupInfo> *)&(in_RDI->totals).assertions.failed);
  if (bVar1) {
    printSummaryDivider(in_RSI);
    poVar2 = std::operator<<((ostream *)in_RDI[3].totals.testCases.passed,"Summary for group \'");
    poVar2 = std::operator<<(poVar2,(string *)
                                    &(in_RSI->super_StreamingReporterBase).
                                     super_SharedImpl<Catch::IStreamingReporter>.m_rc);
    std::operator<<(poVar2,"\':\n");
    printTotals(in_stack_00000150,in_stack_00000148);
    poVar2 = std::operator<<((ostream *)in_RDI[3].totals.testCases.passed,"\n");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  StreamingReporterBase::testGroupEnded(&in_RSI->super_StreamingReporterBase,in_RDI);
  return;
}

Assistant:

virtual void testGroupEnded( TestGroupStats const& _testGroupStats ) {
            if( !unusedGroupInfo ) {
                printSummaryDivider();
                stream << "Summary for group '" << _testGroupStats.groupInfo.name << "':\n";
                printTotals( _testGroupStats.totals );
                stream << "\n" << std::endl;
            }
            StreamingReporterBase::testGroupEnded( _testGroupStats );
        }